

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_expect_semi(JSParseState *s)

{
  JSToken *token;
  byte bVar1;
  JSFunctionDef *pJVar2;
  uint uVar3;
  int iVar4;
  JSAtom JVar5;
  int c;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  JSValueUnion JVar9;
  char *fmt;
  JSValue v;
  byte *pbStack_48;
  BOOL BStack_3c;
  byte *pbStack_38;
  
  iVar4 = (s->token).val;
  if (iVar4 == -0x56) {
    return 0;
  }
  if (iVar4 != 0x3b) {
    if (iVar4 == 0x7d) {
      return 0;
    }
    if (s->got_lf == 0) {
      js_parse_error(s,"expecting \'%c\'",0x3b);
      return -1;
    }
    return 0;
  }
  if (&stack0xfffffffffffffff8 < (undefined1 *)s->ctx->rt->stack_limit) {
    js_parse_error(s,"stack overflow");
    return -1;
  }
  token = &s->token;
  free_token(s,token);
  pbStack_38 = s->buf_ptr;
  s->last_ptr = pbStack_38;
  s->got_lf = 0;
  s->last_line_num = (s->token).line_num;
LAB_00153502:
  iVar4 = s->line_num;
  (s->token).line_num = iVar4;
  (s->token).ptr = pbStack_38;
  bVar1 = *pbStack_38;
  uVar3 = (uint)bVar1;
  switch(bVar1) {
  case 0:
    uVar3 = 0;
    if (s->buf_end <= pbStack_38) {
      token->val = -0x56;
      goto LAB_00153f30;
    }
    break;
  default:
    if (-1 < (char)bVar1) break;
    uVar3 = unicode_from_utf8(pbStack_38,6,&pbStack_38);
    if ((uVar3 & 0xfffffffe) == 0x2028) goto LAB_00153542;
    iVar4 = lre_is_space(uVar3);
    if (iVar4 == 0) goto LAB_00153d03;
    goto LAB_00153502;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pbStack_38 = pbStack_38 + 1;
    goto LAB_00153502;
  case 10:
    goto switchD_00153526_caseD_a;
  case 0xd:
    if (pbStack_38[1] == 10) {
      pbStack_38 = pbStack_38 + 1;
    }
switchD_00153526_caseD_a:
    pbStack_38 = pbStack_38 + 1;
LAB_00153542:
    s->got_lf = 1;
    s->line_num = s->line_num + 1;
    goto LAB_00153502;
  case 0x21:
    uVar3 = 0x21;
    if (pbStack_38[1] == 0x3d) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x60;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x61;
      }
      goto LAB_00153f30;
    }
    break;
  case 0x22:
  case 0x27:
    iVar4 = js_parse_string(s,(uint)bVar1,1,pbStack_38 + 1,token,&pbStack_38);
    if (iVar4 != 0) goto LAB_00153c68;
    goto LAB_00153f30;
  case 0x23:
    pbVar8 = pbStack_38 + 1;
    pbStack_48 = pbStack_38 + 2;
    bVar1 = pbStack_38[1];
    uVar3 = (uint)bVar1;
    pbStack_38 = pbVar8;
    if ((bVar1 == 0x5c) && (*pbStack_48 == 0x75)) {
      uVar3 = lre_parse_escape(&pbStack_48,1);
    }
    else if ((char)bVar1 < '\0') {
      uVar3 = unicode_from_utf8(pbVar8,6,&pbStack_48);
    }
    if (uVar3 < 0x80) {
      uVar6 = (uint)((lre_id_start_table_ascii[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
    }
    else {
      uVar6 = lre_is_id_start(uVar3);
    }
    if (uVar6 == 0) {
      JVar5 = js_parse_error(s,"invalid first character of private name");
LAB_00153d5b:
      iVar4 = 5;
    }
    else {
      pbStack_38 = pbStack_48;
      BStack_3c = 0;
      JVar5 = parse_ident(s,&pbStack_38,&BStack_3c,uVar3,1);
      if (JVar5 == 0) goto LAB_00153d5b;
      (s->token).u.ident.atom = JVar5;
      (s->token).val = -0x57;
      iVar4 = 0;
    }
    if (iVar4 != 0) goto joined_r0x00153c62;
    goto LAB_00153f30;
  case 0x24:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    pbStack_38 = pbStack_38 + 1;
    uVar3 = (uint)bVar1;
    goto LAB_00153718;
  case 0x25:
    uVar3 = 0x25;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x79;
      goto LAB_00153f30;
    }
    break;
  case 0x26:
    if (pbStack_38[1] == 0x26) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x6f;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5f;
      }
      goto LAB_00153f30;
    }
    uVar3 = 0x26;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x73;
      goto LAB_00153f30;
    }
    break;
  case 0x2a:
    if (pbStack_38[1] == 0x2a) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x70;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5d;
      }
      goto LAB_00153f30;
    }
    uVar3 = 0x2a;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x7b;
      goto LAB_00153f30;
    }
    break;
  case 0x2b:
    if (pbStack_38[1] == 0x2b) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x6b;
      goto LAB_00153f30;
    }
    uVar3 = 0x2b;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x78;
      goto LAB_00153f30;
    }
    break;
  case 0x2d:
    if (pbStack_38[1] == 0x2d) {
      if (((s->allow_html_comments != 0) && (pbStack_38[2] == 0x3e)) && (s->last_line_num != iVar4))
      goto LAB_001535db;
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x6c;
      goto LAB_00153f30;
    }
    uVar3 = 0x2d;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x77;
      goto LAB_00153f30;
    }
    break;
  case 0x2e:
    if ((pbStack_38[1] == 0x2e) && (pbStack_38[2] == 0x2e)) {
      pbStack_38 = pbStack_38 + 3;
      token->val = -0x5b;
      goto LAB_00153f30;
    }
    uVar3 = 0x2e;
    if ((byte)(pbStack_38[1] - 0x30) < 10) goto switchD_00153526_caseD_31;
    break;
  case 0x2f:
    bVar1 = pbStack_38[1];
    if (bVar1 == 0x2a) {
      pbStack_38 = pbStack_38 + 2;
LAB_00153680:
      for (; bVar1 = *pbStack_38, bVar1 < 0xd; pbStack_38 = pbStack_38 + 1) {
        if (bVar1 == 0) {
          if (pbStack_38 < s->buf_end) break;
          fmt = "unexpected end of comment";
          goto LAB_00153804;
        }
LAB_001536b4:
        if (bVar1 != 10) goto LAB_001536c5;
        s->line_num = s->line_num + 1;
LAB_001536bc:
        s->got_lf = 1;
LAB_001536c9:
      }
      if (bVar1 == 0xd) goto LAB_001536bc;
      if (bVar1 != 0x2a) {
LAB_001536c5:
        if (-1 < (char)bVar1) goto LAB_001536c9;
        uVar3 = unicode_from_utf8(pbStack_38,6,&pbStack_38);
        if ((uVar3 & 0xfffffffe) == 0x2028) {
          s->got_lf = 1;
        }
        else if (uVar3 == 0xffffffff) {
          pbStack_38 = pbStack_38 + 1;
        }
        goto LAB_00153680;
      }
      if (pbStack_38[1] != 0x2f) goto LAB_001536b4;
      pbStack_38 = pbStack_38 + 2;
    }
    else {
      if (bVar1 != 0x2f) {
        if (bVar1 == 0x3d) {
          pbStack_38 = pbStack_38 + 2;
          token->val = -0x7a;
        }
        else {
          pbStack_38 = pbStack_38 + 1;
          token->val = 0x2f;
        }
        goto LAB_00153f30;
      }
      pbStack_38 = pbStack_38 + 2;
LAB_001535db:
      while (((bVar1 = *pbStack_38, bVar1 != 0 || (pbStack_38 < s->buf_end)) &&
             ((bVar1 != 10 && (bVar1 != 0xd))))) {
        if ((char)bVar1 < '\0') {
          uVar3 = unicode_from_utf8(pbStack_38,6,&pbStack_38);
          if ((uVar3 & 0xfffffffe) == 0x2028) break;
          if (uVar3 == 0xffffffff) {
            pbStack_38 = pbStack_38 + 1;
          }
        }
        else {
          pbStack_38 = pbStack_38 + 1;
        }
      }
    }
    goto LAB_00153502;
  case 0x30:
    if ((pbStack_38[1] - 0x3a < 0xfffffff6) || ((s->cur_func->js_mode & 1) == 0))
    goto switchD_00153526_caseD_31;
    fmt = "octal literals are deprecated in strict mode";
    goto LAB_00153804;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_00153526_caseD_31:
    v = js_atof(s->ctx,(char *)pbStack_38,(char **)&pbStack_38,0,0x34);
    JVar9 = v.u;
    iVar4 = 5;
    if ((int)v.tag != 6) {
      if (((ulong)JVar9.ptr & 0x7fffffffffffffff) < 0x7ff0000000000001 || v.tag != 7) {
        c = unicode_from_utf8(pbStack_38,6,&pbStack_48);
        JVar9._0_4_ = lre_js_is_ident_next(c);
        JVar9._4_4_ = 0;
        if (JVar9._0_4_ == 0) {
          (s->token).val = -0x80;
          (s->token).u.str.str = v;
          iVar4 = 0;
          goto LAB_00153c55;
        }
      }
      JS_FreeValue(s->ctx,v);
      JVar9._0_4_ = js_parse_error(s,"invalid number literal");
      JVar9._4_4_ = 0;
    }
LAB_00153c55:
    JVar5 = JVar9.int32;
    if (iVar4 == 0) goto LAB_00153f30;
joined_r0x00153c62:
    if (iVar4 != 5) {
      return JVar5;
    }
    goto LAB_00153c68;
  case 0x3c:
    bVar1 = pbStack_38[1];
    if (bVar1 == 0x3c) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x76;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x6a;
      }
      goto LAB_00153f30;
    }
    if (bVar1 == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x66;
      goto LAB_00153f30;
    }
    uVar3 = 0x3c;
    if ((((bVar1 == 0x21) && (s->allow_html_comments != 0)) && (pbStack_38[2] == 0x2d)) &&
       (pbStack_38[3] == 0x2d)) goto LAB_001535db;
    break;
  case 0x3d:
    if (pbStack_38[1] == 0x3e) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x5c;
      goto LAB_00153f30;
    }
    uVar3 = 0x3d;
    if (pbStack_38[1] == 0x3d) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x62;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -99;
      }
      goto LAB_00153f30;
    }
    break;
  case 0x3e:
    if (pbStack_38[1] == 0x3e) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x75;
      }
      else if (pbStack_38[2] == 0x3e) {
        if (pbStack_38[3] == 0x3d) {
          pbStack_38 = pbStack_38 + 4;
          token->val = -0x74;
        }
        else {
          pbStack_38 = pbStack_38 + 3;
          token->val = -0x68;
        }
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x69;
      }
      goto LAB_00153f30;
    }
    uVar3 = 0x3e;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -100;
      goto LAB_00153f30;
    }
    break;
  case 0x3f:
    uVar3 = 0x3f;
    if (pbStack_38[1] == 0x2e) {
      if (9 < (byte)(pbStack_38[2] - 0x30)) {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x59;
        goto LAB_00153f30;
      }
    }
    else if (pbStack_38[1] == 0x3f) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x6d;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5a;
      }
      goto LAB_00153f30;
    }
    break;
  case 0x5c:
    uVar3 = 0x5c;
    if (pbStack_38[1] == 0x75) {
      pbStack_48 = pbStack_38 + 1;
      uVar6 = lre_parse_escape(&pbStack_48,1);
      iVar4 = 0;
      pbVar8 = (byte *)(ulong)uVar6;
      uVar3 = 0x5c;
      if (-1 < (int)uVar6) {
        if (uVar6 < 0x80) {
          pbVar8 = (byte *)(ulong)((lre_id_start_table_ascii[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0
                                  );
        }
        else {
          uVar7 = lre_is_id_start(uVar6);
          pbVar8 = (byte *)(ulong)uVar7;
        }
        if ((int)pbVar8 != 0) {
          pbStack_38 = pbStack_48;
          BStack_3c = 1;
          iVar4 = 0xc;
          pbVar8 = pbStack_48;
          uVar3 = uVar6;
        }
      }
      if (iVar4 != 0) {
        if (iVar4 != 0xc) {
          return (int)pbVar8;
        }
        goto LAB_0015371f;
      }
    }
    break;
  case 0x5e:
    uVar3 = 0x5e;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x72;
      goto LAB_00153f30;
    }
    break;
  case 0x60:
    iVar4 = js_parse_template_part(s,pbStack_38 + 1);
    if (iVar4 != 0) goto LAB_00153c68;
    pbStack_38 = s->buf_ptr;
    goto LAB_00153f30;
  case 0x7c:
    if (pbStack_38[1] == 0x7c) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x6e;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5e;
      }
      goto LAB_00153f30;
    }
    uVar3 = 0x7c;
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x71;
      goto LAB_00153f30;
    }
  }
  token->val = uVar3;
  pbStack_38 = pbStack_38 + 1;
  goto LAB_00153f30;
LAB_00153d03:
  if (uVar3 < 0x80) {
    uVar6 = (uint)((lre_id_start_table_ascii[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
  }
  else {
    uVar6 = lre_is_id_start(uVar3);
  }
  if (uVar6 == 0) {
    fmt = "unexpected character";
LAB_00153804:
    js_parse_error(s,fmt);
LAB_00153c68:
    token->val = -0x58;
    return -1;
  }
LAB_00153718:
  BStack_3c = 0;
LAB_0015371f:
  JVar5 = parse_ident(s,&pbStack_38,&BStack_3c,uVar3,0);
  if (JVar5 == 0) goto LAB_00153c68;
  (s->token).u.ident.atom = JVar5;
  (s->token).u.ident.has_escape = BStack_3c;
  (s->token).u.ident.is_reserved = 0;
  if ((0x24 < JVar5) && ((0x2d < JVar5 || ((s->cur_func->js_mode & 1) == 0)))) {
    if (JVar5 != 0x2e) {
      if (JVar5 == 0x2d) {
        pJVar2 = s->cur_func;
        if (((*(ushort *)&pJVar2->field_0x84 & 1) != 0) ||
           (((((*(ushort *)&pJVar2->field_0x84 & 0xff00) == 0x300 && (pJVar2->in_function_body == 0)
              ) && (pJVar2->parent != (JSFunctionDef *)0x0)) &&
            ((pJVar2->parent->field_0x84 & 1) != 0)))) goto LAB_00153752;
      }
LAB_001537e6:
      token->val = -0x7d;
      goto LAB_00153f30;
    }
    if (s->is_module == 0) {
      pJVar2 = s->cur_func;
      if (((*(ushort *)&pJVar2->field_0x84 & 2) == 0) &&
         ((((*(ushort *)&pJVar2->field_0x84 & 0xff00) != 0x300 || (pJVar2->in_function_body != 0))
          || ((pJVar2->parent == (JSFunctionDef *)0x0 || ((pJVar2->parent->field_0x84 & 2) == 0)))))
         ) goto LAB_001537e6;
    }
  }
LAB_00153752:
  if (BStack_3c == 0) {
    token->val = JVar5 - 0x56;
  }
  else {
    (s->token).u.ident.is_reserved = 1;
    (s->token).val = -0x7d;
  }
LAB_00153f30:
  s->buf_ptr = pbStack_38;
  return 0;
}

Assistant:

static int js_parse_expect_semi(JSParseState *s)
{
    if (s->token.val != ';') {
        /* automatic insertion of ';' */
        if (s->token.val == TOK_EOF || s->token.val == '}' || s->got_lf) {
            return 0;
        }
        return js_parse_error(s, "expecting '%c'", ';');
    }
    return next_token(s);
}